

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_set_gej_zinv(secp256k1_ge *r,secp256k1_gej *a,secp256k1_fe *zi)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  secp256k1_gej *psVar51;
  secp256k1_fe *psVar52;
  ulong uVar53;
  ulong uVar54;
  uint64_t tmp3;
  uint64_t tmp2;
  secp256k1_fe zi3;
  secp256k1_fe zi2;
  secp256k1_fe local_90;
  secp256k1_fe local_60;
  
  psVar51 = a;
  secp256k1_gej_verify(a);
  psVar52 = zi;
  secp256k1_fe_verify(zi);
  if (a->infinity == 0) {
    psVar52 = zi;
    secp256k1_fe_verify(zi);
    if (zi->magnitude < 9) {
      uVar50 = zi->n[0];
      uVar54 = zi->n[1];
      uVar2 = zi->n[2];
      uVar3 = zi->n[3];
      uVar4 = zi->n[4];
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar50 * 2;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar3;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar54 * 2;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar2;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar4;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar4;
      uVar48 = SUB168(auVar7 * auVar27,0);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar48 & 0xfffffffffffff;
      auVar5 = auVar6 * auVar26 + auVar5 * auVar25 + auVar8 * ZEXT816(0x1000003d10);
      uVar49 = auVar5._0_8_;
      local_90.n[0] = uVar49 & 0xfffffffffffff;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar49 >> 0x34 | auVar5._8_8_ << 0xc;
      uVar4 = uVar4 * 2;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar50;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar4;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar54 * 2;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar3;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar2;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar2;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar48 >> 0x34 | SUB168(auVar7 * auVar27,8) << 0xc;
      auVar5 = auVar9 * auVar28 + auVar41 + auVar10 * auVar29 + auVar11 * auVar30 +
               auVar12 * ZEXT816(0x1000003d10);
      uVar48 = auVar5._0_8_;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar48 >> 0x34 | auVar5._8_8_ << 0xc;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar50;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar50;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar54;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar4;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar2 * 2;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = uVar3;
      auVar5 = auVar14 * auVar32 + auVar42 + auVar15 * auVar33;
      uVar49 = auVar5._0_8_;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar49 >> 0x34 | auVar5._8_8_ << 0xc;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = (uVar49 & 0xfffffffffffff) << 4 | (uVar48 & 0xfffffffffffff) >> 0x30;
      auVar5 = auVar13 * auVar31 + ZEXT816(0x1000003d1) * auVar34;
      uVar49 = auVar5._0_8_;
      local_60.n[0] = uVar49 & 0xfffffffffffff;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar49 >> 0x34 | auVar5._8_8_ << 0xc;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar50 * 2;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar54;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar2;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar4;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar3;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar3;
      auVar6 = auVar17 * auVar36 + auVar44 + auVar18 * auVar37;
      uVar49 = auVar6._0_8_;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar49 & 0xfffffffffffff;
      auVar5 = auVar16 * auVar35 + auVar43 + auVar19 * ZEXT816(0x1000003d10);
      uVar53 = auVar5._0_8_;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar49 >> 0x34 | auVar6._8_8_ << 0xc;
      local_60.n[1] = uVar53 & 0xfffffffffffff;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = uVar53 >> 0x34 | auVar5._8_8_ << 0xc;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar50 * 2;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar2;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar54;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar54;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar3;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar4;
      auVar46 = auVar22 * auVar40 + auVar46;
      uVar50 = auVar46._0_8_;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar50 & 0xfffffffffffff;
      auVar5 = auVar20 * auVar38 + auVar45 + auVar21 * auVar39 + auVar23 * ZEXT816(0x1000003d10);
      uVar54 = auVar5._0_8_;
      local_60.n[2] = uVar54 & 0xfffffffffffff;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = (uVar54 >> 0x34 | auVar5._8_8_ << 0xc) + local_90.n[0];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar50 >> 0x34 | auVar46._8_8_ << 0xc;
      auVar47 = auVar24 * ZEXT816(0x1000003d10) + auVar47;
      uVar50 = auVar47._0_8_;
      local_60.n[3] = uVar50 & 0xfffffffffffff;
      local_60.n[4] = (uVar50 >> 0x34 | auVar47._8_8_ << 0xc) + (uVar48 & 0xffffffffffff);
      local_60.magnitude = 1;
      local_60.normalized = 0;
      secp256k1_fe_verify(&local_60);
      secp256k1_fe_mul(&local_90,&local_60,zi);
      secp256k1_fe_mul(&r->x,&a->x,&local_60);
      secp256k1_fe_mul(&r->y,&a->y,&local_90);
      r->infinity = a->infinity;
      secp256k1_ge_verify(r);
      return;
    }
  }
  else {
    secp256k1_ge_set_gej_zinv_cold_1();
  }
  secp256k1_ge_set_gej_zinv_cold_2();
  uVar1 = *(uint *)((long)(psVar51->x).n + 0x1c);
  psVar52->n[0] =
       (ulong)(*(byte *)((long)(psVar51->x).n + 0x19) & 0xf) << 0x30 |
       (ulong)CONCAT15(*(undefined1 *)((long)(psVar51->x).n + 0x1a),
                       CONCAT14(*(undefined1 *)((long)(psVar51->x).n + 0x1b),
                                uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                                uVar1 << 0x18));
  psVar52->n[1] =
       (ulong)*(byte *)((long)(psVar51->x).n + 0x13) << 0x2c |
       (ulong)*(byte *)((long)(psVar51->x).n + 0x14) << 0x24 |
       (ulong)*(byte *)((long)(psVar51->x).n + 0x15) << 0x1c |
       (ulong)((uint)*(byte *)((long)(psVar51->x).n + 0x16) << 0x14 |
              (uint)*(byte *)((long)(psVar51->x).n + 0x17) << 0xc |
              (uint)(byte)(psVar51->x).n[3] << 4 |
              (uint)(*(byte *)((long)(psVar51->x).n + 0x19) >> 4));
  uVar1 = *(uint *)((long)(psVar51->x).n + 0xf);
  psVar52->n[2] =
       (ulong)(*(byte *)((long)(psVar51->x).n + 0xc) & 0xf) << 0x30 |
       (ulong)CONCAT15(*(undefined1 *)((long)(psVar51->x).n + 0xd),
                       CONCAT14(*(undefined1 *)((long)(psVar51->x).n + 0xe),
                                uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                                uVar1 << 0x18));
  psVar52->n[3] =
       (ulong)*(byte *)((long)(psVar51->x).n + 6) << 0x2c |
       (ulong)*(byte *)((long)(psVar51->x).n + 7) << 0x24 |
       (ulong)(byte)(psVar51->x).n[1] << 0x1c |
       (ulong)((uint)*(byte *)((long)(psVar51->x).n + 9) << 0x14 |
              (uint)*(byte *)((long)(psVar51->x).n + 10) << 0xc |
              (uint)*(byte *)((long)(psVar51->x).n + 0xb) << 4 |
              (uint)(*(byte *)((long)(psVar51->x).n + 0xc) >> 4));
  uVar1 = *(uint *)((long)(psVar51->x).n + 2);
  psVar52->n[4] =
       (ulong)CONCAT15((char)(psVar51->x).n[0],
                       CONCAT14(*(undefined1 *)((long)(psVar51->x).n + 1),
                                uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                                uVar1 << 0x18));
  return;
}

Assistant:

static void secp256k1_ge_set_gej_zinv(secp256k1_ge *r, const secp256k1_gej *a, const secp256k1_fe *zi) {
    secp256k1_fe zi2;
    secp256k1_fe zi3;
    secp256k1_gej_verify(a);
    secp256k1_fe_verify(zi);
    VERIFY_CHECK(!a->infinity);
    secp256k1_fe_sqr(&zi2, zi);
    secp256k1_fe_mul(&zi3, &zi2, zi);
    secp256k1_fe_mul(&r->x, &a->x, &zi2);
    secp256k1_fe_mul(&r->y, &a->y, &zi3);
    r->infinity = a->infinity;
    secp256k1_ge_verify(r);
}